

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets.cpp
# Opt level: O2

void lts2::WaveletTransform(Mat *X,int Jmin,string *wavelet,uint options)

{
  double dVar1;
  vector<int,_std::allocator<int>_> Jlist;
  int local_3c;
  _Vector_base<int,_std::allocator<int>_> local_38;
  
  dVar1 = log2((double)*(int *)(X + 8));
  dVar1 = floor(dVar1);
  local_3c = (int)dVar1;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while (local_3c = local_3c + -1, Jmin < local_3c) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&local_38,&local_3c);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

void lts2::WaveletTransform(cv::Mat const &X, int Jmin, std::string const &wavelet, unsigned int options)
{
  float const h[] = {1.586134342, -.05298011854, -.8829110762, .4435068522, 1.149604398};
  bool isReverse = false;
  bool isTranslationInvariant = false;
    
  //---------------- Handle separable wavelet transform here ----------------
    
  //---------------- Non-separable case ----------------
    
  int n = X.rows;
  int m = (sizeof(h)/sizeof(float) - 1)/2;
  int Jmax = (int)floor(log2(n)) - 1;

  std::vector<int> Jlist;
  int j = Jmax;
  while (j > Jmin) 
  {
    Jlist.push_back(j);
    --j;
  }
  if (isReverse)
  {
    std::reverse(Jlist.begin(), Jlist.end());
  }
    
  if (isTranslationInvariant == false)
  {
    std::vector<int>::const_iterator it_j = Jlist.begin();
    for ( ; it_j != Jlist.end(); ++it_j)
    {
      // Horizontal lifting step
      // Vertical lifting step
    }
  }
  else
  {
        
  }
}